

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_Swap_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Swap_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *pdVar1;
  pointer ppVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  type tVar10;
  size_type sVar11;
  size_type sVar12;
  pointer ppVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  pair<const_int,_int> pVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  int i;
  int iVar20;
  float fVar21;
  pair<unsigned_long,_unsigned_long> pVar22;
  Settings __tmp;
  AssertionResult gtest_ar;
  size_type expected_buckets;
  TypeParam other_ht;
  hasher hasher;
  KeyInfo __tmp_1;
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  local_238;
  ulong uStack_210;
  undefined1 local_200 [8];
  dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_1f8;
  pointer ppStack_1f0;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_1e8;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pBStack_1e0;
  float local_1d8;
  float fStack_1d4;
  ulong uStack_1d0;
  Hasher local_1c8;
  type tStack_1bc;
  type local_1b8;
  size_type local_1b0;
  size_type sStack_1a8;
  ulong local_1a0;
  pointer local_188;
  dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_180;
  undefined1 local_178 [8];
  pointer local_170;
  pointer ppStack_168;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_160;
  ulong uStack_158;
  float local_150;
  float fStack_14c;
  undefined8 uStack_148;
  Hasher local_140;
  int iStack_134;
  type local_130;
  size_type local_128;
  size_type sStack_120;
  ulong local_118;
  pointer local_100;
  key_equal local_f8;
  value_type local_e8;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_e0;
  Hasher local_60;
  Hasher local_54 [3];
  
  local_54[0].id_ = 1;
  local_54[0].num_hashes_ = 0;
  local_54[0].num_compares_ = 0;
  local_178 = (undefined1  [8])((ulong)local_178 & 0xffffffff00000000);
  local_170 = (pointer)0x0;
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)&local_e0,200,(hasher *)local_54,(key_equal *)local_54,(allocator_type *)local_178);
  pVar16 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  local_180 = &(this->
               super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(local_180);
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.settings + 0x2a) = true;
  *(int *)((long)&(this->
                  super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ).
                  super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.
                  super_BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.rep.key_info + 0xc) = pVar16.first;
  pVar16 = UniqueObjectHelper<std::pair<int_const,int>>(2);
  this_00 = &local_e0.ht_;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&this_00->rep);
  local_e0.ht_.rep.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  use_deleted_ = true;
  local_e0.ht_.rep.key_info.delkey = pVar16.first;
  iVar20 = 3;
  do {
    local_200 = (undefined1  [8])UniqueObjectHelper<std::pair<int_const,int>>(iVar20);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
              *)local_178,
             &(this->
              super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ).
              super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.
              super_BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ,(value_type *)local_200);
    iVar20 = iVar20 + 1;
  } while (iVar20 != 2000);
  pVar16 = UniqueObjectHelper<std::pair<int_const,int>>(1000);
  local_178._0_4_ = pVar16.first;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(local_180,(key_type *)local_178);
  local_200 = (undefined1  [8])UniqueObjectHelper<std::pair<int_const,int>>(0x7d1);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_178,&local_e0,(value_type *)local_200);
  local_e8.first = (undefined4)local_e0.ht_.rep.num_buckets;
  local_e8.second = local_e0.ht_.rep.num_buckets._4_4_;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::swap(local_180,&this_00->rep);
  pVar16 = UniqueObjectHelper<std::pair<int_const,int>>(2);
  local_200._0_4_ = pVar16.first;
  local_238.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.super_iterator.ht._4_4_,
                   *(type *)((long)&(this->
                                    super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                    ).
                                    super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                    .ht_.
                                    super_BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                    .ht_.rep.key_info + 0xc));
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_178,"this->UniqueKey(2)","this->ht_.deleted_key()",(int *)local_200,
             (int *)&local_238);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_170 == (pointer)0x0) {
      pVar16 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar16 = *local_170;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1db,(char *)pVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((value_type)local_200 != (value_type)0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  ppVar2 = local_170;
  if (local_170 != (pointer)0x0) {
    if (*local_170 != (pair<const_int,_int>)(local_170 + 2)) {
      operator_delete((void *)*local_170);
    }
    operator_delete(ppVar2);
  }
  pVar16 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  local_200._0_4_ = pVar16.first;
  local_238.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.super_iterator.ht._4_4_,local_e0.ht_.rep.key_info.delkey);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_178,"this->UniqueKey(1)","other_ht.deleted_key()",(int *)local_200,
             (int *)&local_238);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_170 == (pointer)0x0) {
      pVar16 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar16 = *local_170;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1dc,(char *)pVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((value_type)local_200 != (value_type)0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  ppVar2 = local_170;
  if (local_170 != (pointer)0x0) {
    if (*local_170 != (pair<const_int,_int>)(local_170 + 2)) {
      operator_delete((void *)*local_170);
    }
    operator_delete(ppVar2);
  }
  local_200._0_4_ = 1;
  local_238.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.super_iterator.ht._4_4_,
                   (local_180->settings).
                   super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                   super_TransparentHasher.super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_178,"1","this->ht_.hash_funct().id()",(int *)local_200,
             (int *)&local_238);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_170 == (pointer)0x0) {
      pVar16 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar16 = *local_170;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1de,(char *)pVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((value_type)local_200 != (value_type)0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  ppVar2 = local_170;
  if (local_170 != (pointer)0x0) {
    if (*local_170 != (pair<const_int,_int>)(local_170 + 2)) {
      operator_delete((void *)*local_170);
    }
    operator_delete(ppVar2);
  }
  local_200 = (undefined1  [8])((ulong)local_200 & 0xffffffff00000000);
  local_238.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.super_iterator.ht._4_4_,
                   local_e0.ht_.rep.settings.
                   super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                   super_TransparentHasher.super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_178,"0","other_ht.hash_funct().id()",(int *)local_200,
             (int *)&local_238);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_170 == (pointer)0x0) {
      pVar16 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar16 = *local_170;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1df,(char *)pVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((value_type)local_200 != (value_type)0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  ppVar2 = local_170;
  if (local_170 != (pointer)0x0) {
    if (*local_170 != (pair<const_int,_int>)(local_170 + 2)) {
      operator_delete((void *)*local_170);
    }
    operator_delete(ppVar2);
  }
  local_200._0_4_ = 1;
  local_238.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.super_iterator.ht._4_4_,
                   (this->
                   super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.key_info.super_TransparentHasher.super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_178,"1","this->ht_.key_eq().id()",(int *)local_200,(int *)&local_238)
  ;
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_170 == (pointer)0x0) {
      pVar16 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar16 = *local_170;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e1,(char *)pVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((value_type)local_200 != (value_type)0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  ppVar2 = local_170;
  if (local_170 != (pointer)0x0) {
    if (*local_170 != (pair<const_int,_int>)(local_170 + 2)) {
      operator_delete((void *)*local_170);
    }
    operator_delete(ppVar2);
  }
  local_200 = (undefined1  [8])((ulong)local_200 & 0xffffffff00000000);
  local_238.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.super_iterator.ht._4_4_,
                   local_e0.ht_.rep.key_info.super_TransparentHasher.super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_178,"0","other_ht.key_eq().id()",(int *)local_200,(int *)&local_238);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_170 == (pointer)0x0) {
      pVar16 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar16 = *local_170;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e2,(char *)pVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((value_type)local_200 != (value_type)0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  ppVar2 = local_170;
  if (local_170 != (pointer)0x0) {
    if (*local_170 != (pair<const_int,_int>)(local_170 + 2)) {
      operator_delete((void *)*local_170);
    }
    operator_delete(ppVar2);
  }
  local_200 = *(undefined1 (*) [8])
               &(this->
                super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ).
                super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.
                super_BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.rep.num_buckets;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_178,"expected_buckets","this->ht_.bucket_count()",
             (unsigned_long *)&local_e8,(unsigned_long *)local_200);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_170 == (pointer)0x0) {
      pVar16 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar16 = *local_170;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e4,(char *)pVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((value_type)local_200 != (value_type)0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  ppVar2 = local_170;
  if (local_170 != (pointer)0x0) {
    if (*local_170 != (pair<const_int,_int>)(local_170 + 2)) {
      operator_delete((void *)*local_170);
    }
    operator_delete(ppVar2);
  }
  local_200 = (undefined1  [8])local_e0.ht_.rep.num_buckets;
  local_238.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.super_iterator.ht._4_4_,200);
  testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
            ((internal *)local_178,"other_ht.bucket_count()","200u",(unsigned_long *)local_200,
             (uint *)&local_238);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_170 == (pointer)0x0) {
      pVar16 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar16 = *local_170;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e5,(char *)pVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((value_type)local_200 != (value_type)0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  ppVar2 = local_170;
  if (local_170 != (pointer)0x0) {
    if (*local_170 != (pair<const_int,_int>)(local_170 + 2)) {
      operator_delete((void *)*local_170);
    }
    operator_delete(ppVar2);
  }
  local_238.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.super_iterator.ht._4_4_,1);
  local_200 = (undefined1  [8])
              ((this->
               super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.num_elements -
              (this->
              super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ).
              super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.
              super_BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.rep.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_178,"1u","this->ht_.size()",(uint *)&local_238,
             (unsigned_long *)local_200);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_170 == (pointer)0x0) {
      pVar16 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar16 = *local_170;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e7,(char *)pVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((value_type)local_200 != (value_type)0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  ppVar2 = local_170;
  if (local_170 != (pointer)0x0) {
    if (*local_170 != (pair<const_int,_int>)(local_170 + 2)) {
      operator_delete((void *)*local_170);
    }
    operator_delete(ppVar2);
  }
  local_238.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.super_iterator.ht._4_4_,0x7cc);
  local_200 = (undefined1  [8])(local_e0.ht_.rep.num_elements - local_e0.ht_.rep.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_178,"1996u","other_ht.size()",(uint *)&local_238,
             (unsigned_long *)local_200);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_170 == (pointer)0x0) {
      pVar16 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar16 = *local_170;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e8,(char *)pVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((value_type)local_200 != (value_type)0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  ppVar2 = local_170;
  if (local_170 != (pointer)0x0) {
    if (*local_170 != (pair<const_int,_int>)(local_170 + 2)) {
      operator_delete((void *)*local_170);
    }
    operator_delete(ppVar2);
  }
  local_238.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_238.first.super_iterator.ht & 0xffffffff00000000);
  pVar16 = UniqueObjectHelper<std::pair<int_const,int>>(0x6f);
  local_f8.super_Hasher.id_ = pVar16.first;
  pVar22 = google::
           dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(local_180,(int *)&local_f8);
  local_200._1_7_ = 0;
  local_200[0] = pVar22.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_178,"0u","this->ht_.count(this->UniqueKey(111))",(uint *)&local_238,
             (unsigned_long *)local_200);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_170 == (pointer)0x0) {
      pVar16 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar16 = *local_170;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ea,(char *)pVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((value_type)local_200 != (value_type)0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  ppVar2 = local_170;
  if (local_170 != (pointer)0x0) {
    if (*local_170 != (pair<const_int,_int>)(local_170 + 2)) {
      operator_delete((void *)*local_170);
    }
    operator_delete(ppVar2);
  }
  local_238.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.super_iterator.ht._4_4_,1);
  pVar16 = UniqueObjectHelper<std::pair<int_const,int>>(0x6f);
  local_f8.super_Hasher.id_ = pVar16.first;
  pVar22 = google::
           dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(&this_00->rep,(int *)&local_f8);
  local_200._1_7_ = 0;
  local_200[0] = pVar22.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_178,"1u","other_ht.count(this->UniqueKey(111))",(uint *)&local_238,
             (unsigned_long *)local_200);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_170 == (pointer)0x0) {
      pVar16 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar16 = *local_170;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1eb,(char *)pVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((value_type)local_200 != (value_type)0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  ppVar2 = local_170;
  if (local_170 != (pointer)0x0) {
    if (*local_170 != (pair<const_int,_int>)(local_170 + 2)) {
      operator_delete((void *)*local_170);
    }
    operator_delete(ppVar2);
  }
  local_238.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.super_iterator.ht._4_4_,1);
  pVar16 = UniqueObjectHelper<std::pair<int_const,int>>(0x7d1);
  local_f8.super_Hasher.id_ = pVar16.first;
  pVar22 = google::
           dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(local_180,(int *)&local_f8);
  local_200._1_7_ = 0;
  local_200[0] = pVar22.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_178,"1u","this->ht_.count(this->UniqueKey(2001))",(uint *)&local_238,
             (unsigned_long *)local_200);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_170 == (pointer)0x0) {
      pVar16 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar16 = *local_170;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ec,(char *)pVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((value_type)local_200 != (value_type)0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  ppVar2 = local_170;
  if (local_170 != (pointer)0x0) {
    if (*local_170 != (pair<const_int,_int>)(local_170 + 2)) {
      operator_delete((void *)*local_170);
    }
    operator_delete(ppVar2);
  }
  local_238.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_238.first.super_iterator.ht & 0xffffffff00000000);
  pVar16 = UniqueObjectHelper<std::pair<int_const,int>>(0x7d1);
  local_f8.super_Hasher.id_ = pVar16.first;
  pVar22 = google::
           dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(&this_00->rep,(int *)&local_f8);
  local_200._1_7_ = 0;
  local_200[0] = pVar22.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_178,"0u","other_ht.count(this->UniqueKey(2001))",(uint *)&local_238,
             (unsigned_long *)local_200);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_170 == (pointer)0x0) {
      pVar16 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar16 = *local_170;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ed,(char *)pVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((value_type)local_200 != (value_type)0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  ppVar2 = local_170;
  if (local_170 != (pointer)0x0) {
    if (*local_170 != (pair<const_int,_int>)(local_170 + 2)) {
      operator_delete((void *)*local_170);
    }
    operator_delete(ppVar2);
  }
  local_238.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_238.first.super_iterator.ht & 0xffffffff00000000);
  pVar16 = UniqueObjectHelper<std::pair<int_const,int>>(1000);
  local_f8.super_Hasher.id_ = pVar16.first;
  pVar22 = google::
           dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(local_180,(int *)&local_f8);
  local_200._1_7_ = 0;
  local_200[0] = pVar22.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_178,"0u","this->ht_.count(this->UniqueKey(1000))",(uint *)&local_238,
             (unsigned_long *)local_200);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_170 == (pointer)0x0) {
      pVar16 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar16 = *local_170;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ee,(char *)pVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((value_type)local_200 != (value_type)0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  ppVar2 = local_170;
  if (local_170 != (pointer)0x0) {
    if (*local_170 != (pair<const_int,_int>)(local_170 + 2)) {
      operator_delete((void *)*local_170);
    }
    operator_delete(ppVar2);
  }
  local_238.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_238.first.super_iterator.ht & 0xffffffff00000000);
  pVar16 = UniqueObjectHelper<std::pair<int_const,int>>(1000);
  local_f8.super_Hasher.id_ = pVar16.first;
  pVar22 = google::
           dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(&this_00->rep,(int *)&local_f8);
  local_200._1_7_ = 0;
  local_200[0] = pVar22.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_178,"0u","other_ht.count(this->UniqueKey(1000))",(uint *)&local_238,
             (unsigned_long *)local_200);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_170 == (pointer)0x0) {
      pVar16 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar16 = *local_170;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ef,(char *)pVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((value_type)local_200 != (value_type)0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  ppVar2 = local_170;
  if (local_170 != (pointer)0x0) {
    if (*local_170 != (pair<const_int,_int>)(local_170 + 2)) {
      operator_delete((void *)*local_170);
    }
    operator_delete(ppVar2);
  }
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::swap(local_180,&this_00->rep);
  pVar16 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  local_200._0_4_ = pVar16.first;
  local_238.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.super_iterator.ht._4_4_,
                   *(type *)((long)&(this->
                                    super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                    ).
                                    super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                    .ht_.
                                    super_BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                    .ht_.rep.key_info + 0xc));
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_178,"this->UniqueKey(1)","this->ht_.deleted_key()",(int *)local_200,
             (int *)&local_238);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_170 == (pointer)0x0) {
      pVar16 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar16 = *local_170;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1fc,(char *)pVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((value_type)local_200 != (value_type)0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  ppVar2 = local_170;
  if (local_170 != (pointer)0x0) {
    if (*local_170 != (pair<const_int,_int>)(local_170 + 2)) {
      operator_delete((void *)*local_170);
    }
    operator_delete(ppVar2);
  }
  pVar16 = UniqueObjectHelper<std::pair<int_const,int>>(2);
  local_200._0_4_ = pVar16.first;
  local_238.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.super_iterator.ht._4_4_,local_e0.ht_.rep.key_info.delkey);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_178,"this->UniqueKey(2)","other_ht.deleted_key()",(int *)local_200,
             (int *)&local_238);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_170 == (pointer)0x0) {
      pVar16 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar16 = *local_170;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1fd,(char *)pVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((value_type)local_200 != (value_type)0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  ppVar2 = local_170;
  if (local_170 != (pointer)0x0) {
    if (*local_170 != (pair<const_int,_int>)(local_170 + 2)) {
      operator_delete((void *)*local_170);
    }
    operator_delete(ppVar2);
  }
  local_200 = (undefined1  [8])((ulong)local_200 & 0xffffffff00000000);
  local_238.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.super_iterator.ht._4_4_,
                   (local_180->settings).
                   super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                   super_TransparentHasher.super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_178,"0","this->ht_.hash_funct().id()",(int *)local_200,
             (int *)&local_238);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_170 == (pointer)0x0) {
      pVar16 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar16 = *local_170;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1fe,(char *)pVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((value_type)local_200 != (value_type)0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  ppVar2 = local_170;
  if (local_170 != (pointer)0x0) {
    if (*local_170 != (pair<const_int,_int>)(local_170 + 2)) {
      operator_delete((void *)*local_170);
    }
    operator_delete(ppVar2);
  }
  local_200._0_4_ = 1;
  local_238.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.super_iterator.ht._4_4_,
                   local_e0.ht_.rep.settings.
                   super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                   super_TransparentHasher.super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_178,"1","other_ht.hash_funct().id()",(int *)local_200,
             (int *)&local_238);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_170 == (pointer)0x0) {
      pVar16 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar16 = *local_170;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ff,(char *)pVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((value_type)local_200 != (value_type)0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  ppVar2 = local_170;
  if (local_170 != (pointer)0x0) {
    if (*local_170 != (pair<const_int,_int>)(local_170 + 2)) {
      operator_delete((void *)*local_170);
    }
    operator_delete(ppVar2);
  }
  local_238.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.super_iterator.ht._4_4_,0x7cc);
  local_200 = (undefined1  [8])
              ((this->
               super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.num_elements -
              (this->
              super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ).
              super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.
              super_BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.rep.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_178,"1996u","this->ht_.size()",(uint *)&local_238,
             (unsigned_long *)local_200);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_170 == (pointer)0x0) {
      pVar16 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar16 = *local_170;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x200,(char *)pVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((value_type)local_200 != (value_type)0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  ppVar2 = local_170;
  if (local_170 != (pointer)0x0) {
    if (*local_170 != (pair<const_int,_int>)(local_170 + 2)) {
      operator_delete((void *)*local_170);
    }
    operator_delete(ppVar2);
  }
  local_238.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.super_iterator.ht._4_4_,1);
  local_200 = (undefined1  [8])(local_e0.ht_.rep.num_elements - local_e0.ht_.rep.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_178,"1u","other_ht.size()",(uint *)&local_238,
             (unsigned_long *)local_200);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_170 == (pointer)0x0) {
      pVar16 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar16 = *local_170;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x201,(char *)pVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((value_type)local_200 != (value_type)0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  ppVar2 = local_170;
  if (local_170 != (pointer)0x0) {
    if (*local_170 != (pair<const_int,_int>)(local_170 + 2)) {
      operator_delete((void *)*local_170);
    }
    operator_delete(ppVar2);
  }
  local_238.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.super_iterator.ht._4_4_,1);
  pVar16 = UniqueObjectHelper<std::pair<int_const,int>>(0x6f);
  local_f8.super_Hasher.id_ = pVar16.first;
  pVar22 = google::
           dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(local_180,(int *)&local_f8);
  local_200._1_7_ = 0;
  local_200[0] = pVar22.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_178,"1u","this->ht_.count(this->UniqueKey(111))",(uint *)&local_238,
             (unsigned_long *)local_200);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_170 == (pointer)0x0) {
      pVar16 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar16 = *local_170;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x202,(char *)pVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((value_type)local_200 != (value_type)0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  ppVar2 = local_170;
  if (local_170 != (pointer)0x0) {
    if (*local_170 != (pair<const_int,_int>)(local_170 + 2)) {
      operator_delete((void *)*local_170);
    }
    operator_delete(ppVar2);
  }
  local_238.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_238.first.super_iterator.ht & 0xffffffff00000000);
  pVar16 = UniqueObjectHelper<std::pair<int_const,int>>(0x6f);
  local_f8.super_Hasher.id_ = pVar16.first;
  pVar22 = google::
           dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(&this_00->rep,(int *)&local_f8);
  local_200._1_7_ = 0;
  local_200[0] = pVar22.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_178,"0u","other_ht.count(this->UniqueKey(111))",(uint *)&local_238,
             (unsigned_long *)local_200);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_170 == (pointer)0x0) {
      pVar16 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar16 = *local_170;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x203,(char *)pVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((value_type)local_200 != (value_type)0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  ppVar2 = local_170;
  if (local_170 != (pointer)0x0) {
    if (*local_170 != (pair<const_int,_int>)(local_170 + 2)) {
      operator_delete((void *)*local_170);
    }
    operator_delete(ppVar2);
  }
  local_238.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_238.first.super_iterator.pos =
       (pointer)((ulong)local_238.first.super_iterator.pos._4_4_ << 0x20);
  local_f8.super_Hasher.id_ = 0;
  local_f8.super_Hasher.num_hashes_ = 0;
  local_f8.super_Hasher.num_compares_ = 0;
  local_200 = (undefined1  [8])((ulong)local_200 & 0xffffffff00000000);
  local_1f8 = (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)0x0;
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_178,0,(hasher *)&local_238,&local_f8,(allocator_type *)local_200);
  pVar16 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)&local_170);
  uStack_148._0_3_ = CONCAT12(true,(undefined2)uStack_148);
  iStack_134 = pVar16.first;
  iVar20 = 2;
  do {
    local_238.first.super_iterator.ht =
         (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)UniqueObjectHelper<std::pair<int_const,int>>(iVar20);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
              *)local_200,
             (BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)local_178,(value_type *)&local_238);
    iVar20 = iVar20 + 1;
  } while (iVar20 != 10000);
  local_f8.super_Hasher.id_ = 0;
  local_f8.super_Hasher.num_hashes_ = 0;
  local_f8.super_Hasher.num_compares_ = 0;
  local_60.id_ = 0;
  local_60.num_hashes_ = 0;
  local_60.num_compares_ = 0;
  local_238.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_238.first.super_iterator.ht & 0xffffffff00000000);
  local_238.first.super_iterator.pos = (pointer)0x0;
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_200,0,&local_f8,(key_equal *)&local_60,(allocator_type *)&local_238);
  uVar19 = local_118;
  uVar14 = _local_150;
  ppVar13 = local_188;
  uVar17 = local_1a0;
  sVar12 = sStack_1a8;
  sVar11 = local_1b0;
  tVar10 = local_1b8;
  uVar8 = stack0xfffffffffffffe40;
  uVar6 = local_1c8._0_8_;
  uVar5 = uStack_1d0;
  uVar3 = _local_1d8;
  ppVar2 = ppStack_1f0;
  pdVar1 = local_1f8;
  local_238._32_8_ = _local_1d8;
  uStack_210 = uStack_1d0;
  local_238.first.super_iterator.end = (pointer)local_1e8;
  local_238.first.parent_ = pBStack_1e0;
  local_238.first.super_iterator.ht = local_1f8;
  local_238.first.super_iterator.pos = ppStack_1f0;
  local_1d8 = local_150;
  fStack_1d4 = fStack_14c;
  uVar4 = _local_1d8;
  local_1f8 = (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_170;
  ppStack_1f0 = ppStack_168;
  local_1d8 = (float)uVar3;
  fStack_1d4 = SUB84(uVar3,4);
  local_150 = local_1d8;
  fStack_14c = fStack_1d4;
  uVar15 = _local_150;
  local_170 = (pointer)pdVar1;
  ppStack_168 = ppVar2;
  local_1b8 = local_130;
  local_1c8.id_ = local_140.id_;
  local_1c8.num_hashes_ = local_140.num_hashes_;
  uVar7 = local_1c8._0_8_;
  local_1c8.num_compares_ = local_140.num_compares_;
  tStack_1bc = iStack_134;
  uVar9 = stack0xfffffffffffffe40;
  local_130 = tVar10;
  local_1c8.id_ = (int)uVar6;
  local_1c8.num_hashes_ = SUB84(uVar6,4);
  local_140.id_ = local_1c8.id_;
  local_140.num_hashes_ = local_1c8.num_hashes_;
  local_1c8.num_compares_ = (int)uVar8;
  tStack_1bc = SUB84(uVar8,4);
  local_140.num_compares_ = local_1c8.num_compares_;
  iStack_134 = tStack_1bc;
  local_1b0 = local_128;
  sStack_1a8 = sStack_120;
  local_128 = sVar11;
  sStack_120 = sVar12;
  local_1a0 = local_118;
  local_118 = uVar17;
  local_188 = local_100;
  local_100 = ppVar13;
  local_1d8 = (float)uVar14;
  local_1d8 = local_1d8 * (float)uVar19;
  uVar18 = (ulong)local_1d8;
  local_1e8 = (BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)((long)(local_1d8 - 9.223372e+18) & (long)uVar18 >> 0x3f | uVar18);
  fStack_1d4 = SUB84(uVar14,4);
  fStack_1d4 = (float)uVar19 * fStack_1d4;
  uVar19 = (ulong)fStack_1d4;
  pBStack_1e0 = (BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 *)((long)(fStack_1d4 - 9.223372e+18) & (long)uVar19 >> 0x3f | uVar19);
  uStack_1d0 = uStack_148 & 0xffffffffffffff00;
  fVar21 = (float)uVar17;
  local_150 = (float)uVar3;
  local_150 = local_150 * fVar21;
  uVar17 = (ulong)local_150;
  local_160 = (BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)((long)(local_150 - 9.223372e+18) & (long)uVar17 >> 0x3f | uVar17);
  fStack_14c = SUB84(uVar3,4);
  fVar21 = fVar21 * fStack_14c;
  uStack_158 = (ulong)fVar21;
  uStack_158 = (long)(fVar21 - 9.223372e+18) & (long)uStack_158 >> 0x3f | uStack_158;
  uStack_148 = uVar5 & 0xffffffffffffff00;
  _local_1d8 = uVar4;
  local_1c8._0_8_ = uVar7;
  unique0x100027d9 = uVar9;
  _local_150 = uVar15;
  pVar16 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)&local_170);
  uStack_148._2_1_ = true;
  iStack_134 = pVar16.first;
  iVar20 = 2;
  do {
    local_f8.super_Hasher._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(iVar20);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(&local_238,
             (BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)local_178,(value_type *)&local_f8);
    iVar20 = iVar20 + 1;
  } while (iVar20 != 10000);
  local_200 = (undefined1  [8])&PTR__BaseHashtableInterface_00c24108;
  if (local_188 != (pointer)0x0) {
    free(local_188);
  }
  local_178 = (undefined1  [8])&PTR__BaseHashtableInterface_00c24108;
  if (local_100 != (pointer)0x0) {
    free(local_100);
  }
  local_e0._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c24108;
  if (local_e0.ht_.rep.table != (pointer)0x0) {
    free(local_e0.ht_.rep.table);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Swap) {
  // Let's make a second hashtable with its own hasher, key_equal, etc.
  typename TypeParam::hasher hasher(1);  // 1 is a unique id
  TypeParam other_ht(200, hasher, hasher);

  this->ht_.set_deleted_key(this->UniqueKey(1));
  other_ht.set_deleted_key(this->UniqueKey(2));

  for (int i = 3; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  this->ht_.erase(this->UniqueKey(1000));
  other_ht.insert(this->UniqueObject(2001));
  typename TypeParam::size_type expected_buckets = other_ht.bucket_count();

  this->ht_.swap(other_ht);

  EXPECT_EQ(this->UniqueKey(2), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(1), other_ht.deleted_key());

  EXPECT_EQ(1, this->ht_.hash_funct().id());
  EXPECT_EQ(0, other_ht.hash_funct().id());

  EXPECT_EQ(1, this->ht_.key_eq().id());
  EXPECT_EQ(0, other_ht.key_eq().id());

  EXPECT_EQ(expected_buckets, this->ht_.bucket_count());
  EXPECT_GT(other_ht.bucket_count(), 200u);

  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(1996u, other_ht.size());  // because we erased 1000

  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, other_ht.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1000)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(1000)));

// We purposefully don't swap allocs -- they're not necessarily swappable.

// Now swap back, using the free-function swap
// NOTE: MSVC seems to have trouble with this free swap, not quite
// sure why.  I've given up trying to fix it though.
#ifdef _MSC_VER
  other_ht.swap(this->ht_);
#else
  swap(this->ht_, other_ht);
#endif

  EXPECT_EQ(this->UniqueKey(1), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(2), other_ht.deleted_key());
  EXPECT_EQ(0, this->ht_.hash_funct().id());
  EXPECT_EQ(1, other_ht.hash_funct().id());
  EXPECT_EQ(1996u, this->ht_.size());
  EXPECT_EQ(1u, other_ht.size());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(111)));

  // A user reported a crash with this code using swap to clear.
  // We've since fixed the bug; this prevents a regression.
  TypeParam swap_to_clear_ht;
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
  TypeParam empty_ht;
  empty_ht.swap(swap_to_clear_ht);
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
}